

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int walkWindowList(Walker *pWalker,Window *pList)

{
  int iVar1;
  
  if (pList != (Window *)0x0) {
    do {
      iVar1 = sqlite3WalkExprList(pWalker,pList->pOrderBy);
      if (iVar1 != 0) {
        return 2;
      }
      iVar1 = sqlite3WalkExprList(pWalker,pList->pPartition);
      if (iVar1 != 0) {
        return 2;
      }
      if ((pList->pFilter != (Expr *)0x0) && (iVar1 = walkExpr(pWalker,pList->pFilter), iVar1 != 0))
      {
        return 2;
      }
      pList = pList->pNextWin;
    } while (pList != (Window *)0x0);
  }
  return 0;
}

Assistant:

static int walkWindowList(Walker *pWalker, Window *pList){
  Window *pWin;
  for(pWin=pList; pWin; pWin=pWin->pNextWin){
    if( sqlite3WalkExprList(pWalker, pWin->pOrderBy) ) return WRC_Abort;
    if( sqlite3WalkExprList(pWalker, pWin->pPartition) ) return WRC_Abort;
    if( sqlite3WalkExpr(pWalker, pWin->pFilter) ) return WRC_Abort;
  }
  return WRC_Continue;
}